

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::IntegerCastOperation::HandleDigit<duckdb::IntegerDecimalCastData<short>,false>
               (IntegerDecimalCastData<short> *state,uint8_t digit)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  byte in_SIL;
  long *in_RDI;
  
  lVar3 = *in_RDI;
  lVar2 = NumericLimits<long>::Maximum();
  bVar1 = lVar3 <= (long)(lVar2 - (ulong)in_SIL) / 10;
  if (bVar1) {
    lVar3 = UnsafeNumericCast<long,long,void>(*in_RDI * 10 + (ulong)in_SIL);
    *in_RDI = lVar3;
  }
  return bVar1;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		using store_t = typename T::StoreType;
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.result < (NumericLimits<store_t>::Minimum() + digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 - digit);
		} else {
			if (DUCKDB_UNLIKELY(state.result > (NumericLimits<store_t>::Maximum() - digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 + digit);
		}
		return true;
	}